

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

Entry * __thiscall Ptex::v2_2::PtexReader::MetaData::getEntry(MetaData *this,int index)

{
  size_t *psVar1;
  pointer ppEVar2;
  LargeMetaData *this_00;
  Entry *pEVar3;
  Mutex *__mutex;
  
  if ((index < 0) ||
     (ppEVar2 = (this->_entries).
                super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->_entries).
                         super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2) >> 3) <= index)
     ) {
    pEVar3 = (Entry *)0x0;
  }
  else {
    pEVar3 = ppEVar2[(uint)index];
    if ((pEVar3->isLmd == true) && (pEVar3->lmdData == (LargeMetaData *)0x0)) {
      __mutex = &this->_reader->readlock;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (pEVar3->lmdData == (LargeMetaData *)0x0) {
        this_00 = (LargeMetaData *)operator_new(0x10);
        LargeMetaData::LargeMetaData(this_00,pEVar3->datasize);
        pEVar3->data = this_00->_data;
        LOCK();
        psVar1 = &this->_reader->_memUsed;
        *psVar1 = *psVar1 + (ulong)pEVar3->datasize + 0x10;
        UNLOCK();
        seek(this->_reader,pEVar3->lmdPos);
        readZipBlock(this->_reader,pEVar3->data,pEVar3->lmdZipSize,pEVar3->datasize);
        pEVar3->lmdData = this_00;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  }
  return pEVar3;
}

Assistant:

PtexReader::MetaData::Entry*
PtexReader::MetaData::getEntry(int index)
{
    if (index < 0 || index >= int(_entries.size())) {
        return 0;
    }

    Entry* e = _entries[index];
    if (!e->isLmd) {
        // normal (small) meta data - just return directly
        return e;
    }

    // large meta data - may not be read in yet
    if (e->lmdData) {
        // already in memory
        return e;
    }
    else {
        // not present, must read from file

        // get read lock and make sure we still need to read
        AutoMutex locker(_reader->readlock);
        if (e->lmdData) {
            return e;
        }
        // go ahead and read, keep local until finished
        LargeMetaData* lmdData = new LargeMetaData(e->datasize);
        e->data = (char*) lmdData->data();
        _reader->increaseMemUsed(sizeof(LargeMetaData) + e->datasize);
        _reader->seek(e->lmdPos);
        _reader->readZipBlock(e->data, e->lmdZipSize, e->datasize);
        // update entry
        e->lmdData = lmdData;
        return e;
    }
}